

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  LogDestination *this;
  CheckOpString _result;
  MutexLock local_40;
  LogMessageFatal local_38;
  
  local_38.super_LogMessage.allocated_ =
       (LogMessageData *)CONCAT44(local_38.super_LogMessage.allocated_._4_4_,severity);
  local_40.mu_ = local_40.mu_ & 0xffffffff00000000;
  if (severity < 0) {
    local_40.mu_ = (Mutex *)MakeCheckOpString<int,int>
                                      ((int *)&local_38,(int *)&local_40,"severity >= 0");
  }
  else {
    local_40.mu_ = (Mutex *)0x0;
  }
  if (local_40.mu_ != (Mutex *)0x0) {
    iVar3 = 0x26a;
LAB_001199d5:
    LogMessageFatal::LogMessageFatal
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/glog/src/logging.cc"
               ,iVar3,(CheckOpString *)&local_40);
    LogMessageFatal::~LogMessageFatal(&local_38);
  }
  local_38.super_LogMessage.allocated_ =
       (LogMessageData *)CONCAT44(local_38.super_LogMessage.allocated_._4_4_,severity);
  local_40.mu_ = (Mutex *)0x4;
  if (severity < 4) {
    local_40.mu_ = (Mutex *)0x0;
  }
  else {
    local_40.mu_ = (Mutex *)MakeCheckOpString<int,int>
                                      ((int *)&local_38,(int *)&local_40,"severity < NUM_SEVERITIES"
                                      );
  }
  if (local_40.mu_ != (Mutex *)0x0) {
    iVar3 = 0x26b;
    goto LAB_001199d5;
  }
  local_40.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar3 != 0) goto LAB_001199e2;
  }
  if ((&log_destinations_)[severity] == 0) {
    this = (LogDestination *)operator_new(0xe0);
    LogDestination(this,severity,(char *)0x0);
    (&log_destinations_)[severity] = this;
  }
  lVar1 = (&log_destinations_)[severity];
  local_38.super_LogMessage.allocated_ = (LogMessageData *)(lVar1 + 8);
  if (*(char *)(lVar1 + 0x40) != '\0') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_38.super_LogMessage.allocated_);
    if (iVar3 != 0) {
LAB_001199e2:
      abort();
    }
  }
  pcVar2 = *(char **)(lVar1 + 0x78);
  strlen(symlink_basename);
  std::__cxx11::string::_M_replace(lVar1 + 0x70,0,pcVar2,(ulong)symlink_basename);
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&local_38);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_40);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}